

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyCurve::IsContinuous
          (ON_PolyCurve *this,continuity desired_continuity,double t,int *hint,
          double point_tolerance,double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  double dVar1;
  double dVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  double *pdVar7;
  ON_Curve *pOVar8;
  ON_Object *p;
  ON_Object *p_00;
  ON_ArcCurve *pOVar9;
  ON_ArcCurve *pOVar10;
  double dVar11;
  int *piVar12;
  uint local_174;
  ON_ArcCurve *arc1;
  ON_ArcCurve *arc0;
  bool bIsLinear1;
  bool bIsLinear0;
  double is_linear_min_length;
  double is_linear_tolerance;
  ON_Curve *seg1;
  ON_Curve *seg0;
  int i0;
  undefined1 local_a0 [8];
  ON_Interval cdom;
  ON_Interval sdom;
  ON_Curve *segment_curve;
  double segtol;
  int local_68;
  int segment_index;
  int curve_hint;
  int segment_hint;
  int count;
  bool rc;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  double d2_tolerance_local;
  double d1_tolerance_local;
  double point_tolerance_local;
  int *hint_local;
  double t_local;
  ON_PolyCurve *pOStack_18;
  continuity desired_continuity_local;
  ON_PolyCurve *this_local;
  
  segment_hint._3_1_ = 1;
  _count = curvature_tolerance;
  curvature_tolerance_local = cos_angle_tolerance;
  cos_angle_tolerance_local = d2_tolerance;
  d2_tolerance_local = d1_tolerance;
  d1_tolerance_local = point_tolerance;
  point_tolerance_local = (double)hint;
  hint_local = (int *)t;
  t_local._4_4_ = desired_continuity;
  pOStack_18 = this;
  curve_hint = Count(this);
  piVar12 = hint_local;
  if (0 < curve_hint) {
    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,0);
    piVar3 = hint_local;
    if (((double)piVar12 <= *pdVar7) ||
       (pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,curve_hint),
       *pdVar7 <= (double)piVar3)) {
      bVar4 = ON_Curve::IsContinuous
                        (&this->super_ON_Curve,t_local._4_4_,(double)hint_local,
                         (int *)point_tolerance_local,d1_tolerance_local,d2_tolerance_local,
                         cos_angle_tolerance_local,curvature_tolerance_local,_count);
      return bVar4;
    }
    t_local._4_4_ = ON::ParametricContinuity(t_local._4_4_);
    segment_index = 0;
    local_68 = 0;
    if (point_tolerance_local != 0.0) {
      segment_index = *(uint *)point_tolerance_local & 0x3fff;
    }
    iVar6 = curve_hint + 1;
    pdVar7 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
    segtol._4_4_ = ON_NurbsSpanIndex(2,iVar6,pdVar7,(double)hint_local,1,segment_index);
    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
    dVar1 = *pdVar7;
    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + 1);
    dVar11 = *pdVar7;
    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + 1);
    dVar2 = *pdVar7;
    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
    dVar11 = (ABS(dVar1) + ABS(dVar11) + ABS(dVar2 - *pdVar7)) * 1.490116119385e-08;
    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
    dVar1 = *pdVar7;
    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + 1);
    piVar12 = hint_local;
    if (dVar1 + dVar11 < *pdVar7 - dVar11) {
      pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
      piVar3 = hint_local;
      if ((dVar11 < ABS((double)piVar12 - *pdVar7)) || ((int)segtol._4_4_ < 1)) {
        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + 1);
        if ((ABS((double)piVar3 - *pdVar7) <= dVar11) && ((int)(segtol._4_4_ + 1) < curve_hint)) {
          pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + 1);
          hint_local = (int *)*pdVar7;
          iVar6 = curve_hint + 1;
          pdVar7 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
          segtol._4_4_ = ON_NurbsSpanIndex(2,iVar6,pdVar7,(double)hint_local,1,segment_index);
        }
      }
      else {
        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
        hint_local = (int *)*pdVar7;
      }
    }
    if (point_tolerance_local != 0.0) {
      if (segment_index == segtol._4_4_) {
        local_68 = *(int *)point_tolerance_local >> 0xe;
      }
      else {
        segment_index = segtol._4_4_;
        *(uint *)point_tolerance_local = segtol._4_4_;
      }
    }
    pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
    piVar12 = hint_local;
    if (((double)hint_local <= *pdVar7) ||
       (pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + 1),
       *pdVar7 <= (double)piVar12)) {
      piVar12 = hint_local;
      if (0 < curve_hint) {
        if (segtol._4_4_ == 0) {
          pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,0);
          if (((double)piVar12 == *pdVar7) && (!NAN((double)piVar12) && !NAN(*pdVar7))) {
            segment_hint._3_1_ = 1;
            goto LAB_007fed80;
          }
        }
        piVar12 = hint_local;
        if (segtol._4_4_ == curve_hint - 1U) {
          pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,curve_hint);
          if (((double)piVar12 == *pdVar7) && (!NAN((double)piVar12) && !NAN(*pdVar7))) {
            segment_hint._3_1_ = 1;
            goto LAB_007fed80;
          }
        }
        segment_hint._3_1_ =
             ON_Curve::IsContinuous
                       (&this->super_ON_Curve,t_local._4_4_,(double)hint_local,
                        (int *)point_tolerance_local,d1_tolerance_local,d2_tolerance_local,
                        cos_angle_tolerance_local,curvature_tolerance_local,_count);
        piVar12 = hint_local;
        if (((((bool)segment_hint._3_1_) && (t_local._4_4_ == Gsmooth_continuous)) &&
            (-1 < (int)segtol._4_4_)) && ((int)segtol._4_4_ < curve_hint)) {
          pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
          piVar3 = hint_local;
          if ((double)piVar12 < *pdVar7) {
            local_174 = segtol._4_4_;
          }
          else {
            local_174 = segtol._4_4_ - 1;
          }
          if (-1 < (int)local_174) {
            pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,local_174 + 1);
            if (((double)piVar3 == *pdVar7) && (!NAN((double)piVar3) && !NAN(*pdVar7))) {
              p = (ON_Object *)SegmentCurve(this,local_174);
              p_00 = (ON_Object *)SegmentCurve(this,local_174 + 1);
              if ((p != (ON_Object *)0x0) && (p_00 != (ON_Object *)0x0)) {
                bVar4 = ON_Curve::LastSpanIsLinear((ON_Curve *)p,1e-08,1e-08);
                bVar5 = ON_Curve::FirstSpanIsLinear((ON_Curve *)p_00,1e-08,1e-08);
                if (bVar4 == bVar5) {
                  if (!bVar4) {
                    pOVar9 = ON_ArcCurve::Cast(p);
                    pOVar10 = ON_ArcCurve::Cast(p_00);
                    if (((pOVar9 != (ON_ArcCurve *)0x0) && (pOVar10 != (ON_ArcCurve *)0x0)) &&
                       (bVar4 = ON_ArcToArcTransitionIsNotGsmooth
                                          (&pOVar9->m_arc,&pOVar10->m_arc,curvature_tolerance_local,
                                           _count), bVar4)) {
                      segment_hint._3_1_ = 0;
                    }
                  }
                }
                else {
                  segment_hint._3_1_ = 0;
                }
              }
            }
          }
        }
      }
    }
    else {
      pOVar8 = SegmentCurve(this,segtol._4_4_);
      if (pOVar8 != (ON_Curve *)0x0) {
        ON_Interval::ON_Interval((ON_Interval *)(cdom.m_t + 1));
        ON_Interval::ON_Interval((ON_Interval *)local_a0);
        (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
        cdom.m_t[0] = (double)piVar12;
        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
        dVar1 = *pdVar7;
        pdVar7 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + 1);
        ON_Interval::Set((ON_Interval *)(cdom.m_t + 1),dVar1,*pdVar7);
        hint_local = (int *)ON_Interval::TransformParameterTo
                                      ((ON_Interval *)(cdom.m_t + 1),(ON_Interval *)local_a0,
                                       (double)hint_local);
        iVar6 = (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x37])
                          (hint_local,d1_tolerance_local,SUB84(d2_tolerance_local,0),
                           cos_angle_tolerance_local,curvature_tolerance_local,_count,pOVar8,
                           (ulong)t_local._4_4_,&local_68);
        segment_hint._3_1_ = (byte)iVar6 & 1;
        if (point_tolerance_local != 0.0) {
          *(uint *)point_tolerance_local = segtol._4_4_ | local_68 << 0xe;
        }
      }
    }
  }
LAB_007fed80:
  return (bool)(segment_hint._3_1_ & 1);
}

Assistant:

bool ON_PolyCurve::IsContinuous(
    ON::continuity desired_continuity,
    double t, 
    int* hint, // default = nullptr,
    double point_tolerance, // default=ON_ZERO_TOLERANCE
    double d1_tolerance, // default==ON_ZERO_TOLERANCE
    double d2_tolerance, // default==ON_ZERO_TOLERANCE
    double cos_angle_tolerance, // default==ON_DEFAULT_ANGLE_TOLERANCE_COSINE
    double curvature_tolerance  // default==ON_SQRT_EPSILON
    ) const
{
  bool rc = true;
  const int count = Count();
  if ( count > 0 ) 
  {
    if ( t <= m_t[0] || t >= m_t[count] )
    {
      // 20 March 2003 Dale Lear
      //     Consistently handles locus case and out of domain case.
      rc = ON_Curve::IsContinuous( 
                 desired_continuity, t, hint, 
                 point_tolerance, 
                 d1_tolerance, d2_tolerance, 
                 cos_angle_tolerance, 
                 curvature_tolerance );
      return rc;
    }

    // "locus" and "parametric" are the same at this point.
    desired_continuity = ON::ParametricContinuity((int)desired_continuity);


    int segment_hint = 0, curve_hint = 0;
    if ( hint )
      segment_hint = (*hint & 0x3FFF);
    int segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t,1,segment_hint);

    {
      // 20 March 2003 Dale Lear:
      //     If t is very near interior m_t[] value, see if it
      //     should be set to that value.  A bit or two of 
      //     precision sometimes gets lost in proxy
      //     domain to real curve domain conversions on the interior
      //     of a curve domain.
      double segtol = (fabs(m_t[segment_index]) + fabs(m_t[segment_index+1]) + fabs(m_t[segment_index+1]-m_t[segment_index]))*ON_SQRT_EPSILON;
      if ( m_t[segment_index]+segtol < m_t[segment_index+1]-segtol )
      {
        if ( fabs(t-m_t[segment_index]) <= segtol && segment_index > 0 )
        {
          t = m_t[segment_index];
        }
        else if ( fabs(t-m_t[segment_index+1]) <= segtol && segment_index+1 < count )
        {
          t = m_t[segment_index+1];
          segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t,1,segment_hint);
        }
      }
    }

    if ( hint )
    {
      if ( segment_hint == segment_index )
        curve_hint = ((*hint)>>14);
      else
      {
        segment_hint = segment_index;
        *hint = segment_hint;
      }
    }

    if ( m_t[segment_index] < t && t < m_t[segment_index+1] )
    {
      // test interior of this segment
      const ON_Curve* segment_curve = SegmentCurve(segment_index);
      if ( segment_curve )
      {
        ON_Interval sdom, cdom;
        cdom = segment_curve->Domain();
        sdom.Set( m_t[segment_index], m_t[segment_index+1] );
        t = sdom.TransformParameterTo(cdom, t);
        rc = segment_curve->IsContinuous( desired_continuity, t, &curve_hint, 
                                          point_tolerance, d1_tolerance, d2_tolerance, 
                                          cos_angle_tolerance, curvature_tolerance );
        if ( hint )
          *hint = (segment_index | (curve_hint<<14));
      }
    }
    else if ( count > 0 )
    {
      if ( segment_index == 0 && t == m_t[0] )
        rc = true; // t at start of domain
      else if ( segment_index == count-1 && t == m_t[count] )
        rc = true; // t and end of domain
      else
      {
        // evaluate ends of segments
        rc = ON_Curve::IsContinuous( desired_continuity, t, hint, 
                           point_tolerance, d1_tolerance, d2_tolerance, 
                           cos_angle_tolerance, curvature_tolerance );
        if ( 0 != rc 
             && ON::continuity::Gsmooth_continuous == desired_continuity 
             && segment_index >= 0
             && segment_index < count
           )
        {
          // check for linear to non-linear transition
          const int i0 = ( t >= m_t[segment_index] ) ? segment_index-1 : segment_index;
          if ( i0 >= 0 && t == m_t[i0+1] )
          {
            const ON_Curve* seg0 = SegmentCurve(i0);
            const ON_Curve* seg1 = SegmentCurve(i0+1);
            if ( 0 != seg0 && 0 != seg1 )
            {
              const double is_linear_tolerance = 1.0e-8;  
              const double is_linear_min_length = 1.0e-8;
              bool bIsLinear0 = seg0->LastSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              bool bIsLinear1 = seg1->FirstSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              if ( bIsLinear0 != bIsLinear1 )
                rc = false;
              else if ( !bIsLinear0 )
              {
                const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(seg0);
                const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(seg1);
                if ( 0 != arc0 && 0 != arc1 )
                {
                  if ( ON_ArcToArcTransitionIsNotGsmooth(arc0->m_arc,arc1->m_arc, cos_angle_tolerance, curvature_tolerance ) )
                    rc = false;
                }
              }
            }
          }
        }
      }
    }
  }
  return rc;
}